

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int16_suite::fail_array8_int16_missing_two(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [4];
  
  decoder.current.view._M_str._4_4_ = 0x341204aa;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[4]>
            ((decoder *)local_38,(uchar (*) [4])((long)&decoder.current.view._M_str + 4));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x700,"void compact_int16_suite::fail_array8_int16_missing_two()",local_40,&local_44);
  return;
}

Assistant:

void fail_array8_int16_missing_two()
{
    const value_type input[] = { token::code::array8_int16, 0x04, 0x12, 0x34 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}